

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O0

char * avro::json::typeToString(EntityType t)

{
  EntityType t_local;
  char *local_8;
  
  switch(t) {
  case etNull:
    local_8 = "null";
    break;
  case etBool:
    local_8 = "bool";
    break;
  case etLong:
    local_8 = "long";
    break;
  case etDouble:
    local_8 = "double";
    break;
  case etString:
    local_8 = "string";
    break;
  case etArray:
    local_8 = "array";
    break;
  case etObject:
    local_8 = "object";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

static const char* typeToString(EntityType t)
{
    switch (t) {
    case etNull: return "null";
    case etBool: return "bool";
    case etLong: return "long";
    case etDouble: return "double";
    case etString: return "string";
    case etArray: return "array";
    case etObject: return "object";
    default: return "unknown";
    }
}